

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int get_true_pyr_level(int frame_level,int frame_order,int max_layer_depth)

{
  int local_14;
  int max_layer_depth_local;
  int frame_order_local;
  int frame_level_local;
  int local_4;
  
  if (frame_order == 0) {
    local_4 = 1;
  }
  else {
    local_4 = max_layer_depth;
    if (frame_level != 6) {
      if (frame_level == 7) {
        local_4 = 1;
      }
      else {
        local_14 = frame_level;
        if (frame_level < 1) {
          local_14 = 1;
        }
        local_4 = local_14;
      }
    }
  }
  return local_4;
}

Assistant:

static inline int get_true_pyr_level(int frame_level, int frame_order,
                                     int max_layer_depth) {
  if (frame_order == 0) {
    // Keyframe case
    return MIN_PYR_LEVEL;
  } else if (frame_level == MAX_ARF_LAYERS) {
    // Leaves
    return max_layer_depth;
  } else if (frame_level == (MAX_ARF_LAYERS + 1)) {
    // Altrefs
    return MIN_PYR_LEVEL;
  }
  return AOMMAX(MIN_PYR_LEVEL, frame_level);
}